

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBlobImpl.cpp
# Opt level: O0

void __thiscall Diligent::DataBlobAllocatorAdapter::Free(DataBlobAllocatorAdapter *this,void *Ptr)

{
  bool bVar1;
  DataBlobImpl *this_00;
  void *pvVar2;
  Char *pCVar3;
  undefined1 local_68 [8];
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  void *Ptr_local;
  DataBlobAllocatorAdapter *this_local;
  
  msg.field_2._8_8_ = Ptr;
  bVar1 = RefCntAutoPtr<Diligent::DataBlobImpl>::operator!(&this->m_pDataBlob);
  if (bVar1) {
    FormatString<char[30]>((string *)local_38,(char (*) [30])"Memory has not been allocated");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/DataBlobImpl.cpp"
               ,0x79);
    std::__cxx11::string::~string((string *)local_38);
  }
  this_00 = RefCntAutoPtr<Diligent::DataBlobImpl>::operator->(&this->m_pDataBlob);
  pvVar2 = DataBlobImpl::GetDataPtr(this_00,0);
  if (pvVar2 != (void *)msg.field_2._8_8_) {
    FormatString<char[25]>((string *)local_68,(char (*) [25])"Incorrect memory pointer");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/DataBlobImpl.cpp"
               ,0x7a);
    std::__cxx11::string::~string((string *)local_68);
  }
  RefCntAutoPtr<Diligent::DataBlobImpl>::Release(&this->m_pDataBlob);
  return;
}

Assistant:

void DataBlobAllocatorAdapter::Free(void* Ptr)
{
    VERIFY(m_pDataBlob, "Memory has not been allocated");
    VERIFY(m_pDataBlob->GetDataPtr() == Ptr, "Incorrect memory pointer");
    m_pDataBlob.Release();
}